

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdAddConfidentialTxSignWithPrivkeySimple_Test::TestBody
          (cfdcapi_elements_transaction_CfdAddConfidentialTxSignWithPrivkeySimple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *tx_string;
  int64_t satoshi;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_00000336;
  undefined1 in_stack_00000337;
  char *in_stack_00000338;
  int in_stack_00000340;
  uint32_t in_stack_00000344;
  char *in_stack_00000348;
  char *in_stack_00000350;
  void *in_stack_00000358;
  char *in_stack_00000370;
  int64_t in_stack_00000378;
  char *in_stack_00000380;
  int in_stack_00000388;
  char **in_stack_000003a0;
  bool *in_stack_fffffffffffffdb8;
  AssertionResult *in_stack_fffffffffffffdc0;
  int *rhs;
  CfdErrorCode *in_stack_fffffffffffffdc8;
  CfdErrorCode *lhs;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffddc;
  void *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  char *in_stack_fffffffffffffe58;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  char *local_f8;
  AssertHelper local_f0;
  Message local_e8;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  char *local_a8;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34bd0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x34bd6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34bdc2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(type *)0x34bdf6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x4ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x34bef2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34bf6d);
  local_a0 = 13000000000000;
  local_a8 = (char *)0x0;
  rhs = (int *)0xbd2cc61d000;
  uVar4 = 0;
  uVar3 = 1;
  lhs = (CfdErrorCode *)0x0;
  local_14 = CfdAddConfidentialTxSignWithPrivkeySimple
                       (in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000344,
                        in_stack_00000340,in_stack_00000338,in_stack_00000370,in_stack_00000378,
                        in_stack_00000380,in_stack_00000388,(bool)in_stack_00000337,
                        (bool)in_stack_00000336,in_stack_000003a0);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffddc,uVar4),
             (char *)CONCAT44(in_stack_fffffffffffffdd4,uVar3),lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    in_stack_fffffffffffffe58 =
         testing::AssertionResult::failure_message((AssertionResult *)0x34c0ab);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x509,in_stack_fffffffffffffe58);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x34c10e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c163);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e0,
               "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000\""
               ,"tx_string",
               "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000"
               ,local_a8);
    in_stack_fffffffffffffe57 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!(bool)in_stack_fffffffffffffe57) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34c212);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x50b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message((Message *)0x34c275);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c2ca);
  }
  CfdFreeStringBuffer((char *)lhs);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffdf8);
  if (local_14 != 0) {
    local_f8 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffe58,
                          (char **)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffddc,uVar4),
               (char *)CONCAT44(in_stack_fffffffffffffdd4,uVar3),lhs,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34c3ca);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x514,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x34c427);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c47c);
    testing::internal::CmpHelperSTREQ((internal *)&local_130,"\"\"","str_buffer","",local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34c511);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x515,pcVar2);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x34c56e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c5c3);
    CfdFreeStringBuffer((char *)lhs);
    local_f8 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(lhs);
  local_154 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffddc,uVar4),
             (char *)CONCAT44(in_stack_fffffffffffffdd4,uVar3),lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34c693);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x51b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x34c6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c745);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdAddConfidentialTxSignWithPrivkeySimple) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int64_t satoshi = 13000000000000;
  char* tx_string = nullptr;

  ret = CfdAddConfidentialTxSignWithPrivkeySimple(
      handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
      kCfdP2wpkh, "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6",
      "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1",
      satoshi, nullptr, kCfdSigHashAll, false, true, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000", tx_string);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}